

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::Options::OutputOptionParser::optionDescription_abi_cxx11_
          (string *__return_storage_ptr__,OutputOptionParser *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "Use this option to send all output to a file or a stream. By default output is sent to stdout (note that uses of stdout and stderr from within test cases are redirected and included in the report - so even stderr will effectively end up on stdout). If the name begins with % it is interpreted as a stream. Otherwise it is treated as a filename.\n\nExamples are:\n\n    -o filename.txt\n    -o \"long filename.txt\"\n    -o %stdout\n    -o %stderr\n    -o %debug    \t(The IDE\'s debug output window - currently only Windows\' OutputDebugString is supported)."
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string optionDescription() const {
                return
                    "Use this option to send all output to a file or a stream. By default output is "
                    "sent to stdout (note that uses of stdout and stderr from within test cases are "
                    "redirected and included in the report - so even stderr will effectively end up "
                    "on stdout). If the name begins with % it is interpreted as a stream. "
                    "Otherwise it is treated as a filename.\n"
                    "\n"
                    "Examples are:\n"
                    "\n"
                    "    -o filename.txt\n"
                    "    -o \"long filename.txt\"\n"
                    "    -o %stdout\n"
                    "    -o %stderr\n"
                    "    -o %debug    \t(The IDE's debug output window - currently only Windows' "
                                        "OutputDebugString is supported).";
            }